

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  file_format_t fVar2;
  CmdLine *pCVar3;
  exception_t<cfgfile::string_trait_t> *this;
  ostream *poVar4;
  allocator local_82c;
  allocator local_82b;
  allocator local_82a;
  allocator local_829;
  String local_828;
  String local_808;
  String local_7e8;
  String local_7c8;
  String local_7a8;
  for_generation_t data;
  String local_748;
  String local_728;
  String local_708;
  String local_6e8;
  determine_format_t<cfgfile::string_trait_t> d;
  model_t model;
  ifstream in;
  size_type local_4d0;
  int aiStack_4b8 [2];
  size_type local_4b0;
  ofstream out;
  int aiStack_2b0 [2];
  pointer local_2a8;
  iterator iStack_2a0;
  pointer local_298;
  pointer puStack_290;
  tag_t<cfgfile::string_trait_t> *local_288;
  Command *pCStack_280;
  Command *local_278;
  _Alloc_hider _Stack_270;
  pointer local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_260;
  pointer local_250;
  pointer pbStack_248;
  _Alloc_hider local_240;
  _Alloc_hider local_238;
  undefined1 local_230 [520];
  
  data.m_input_file_name._M_dataplus._M_p = (pointer)&data.m_input_file_name.field_2;
  data.m_input_file_name._M_string_length = 0;
  data.m_input_file_name.field_2._M_local_buf[0] = '\0';
  data.m_output_file_name._M_dataplus._M_p = (pointer)&data.m_output_file_name.field_2;
  data.m_output_file_name._M_string_length = 0;
  data.m_output_file_name.field_2._M_local_buf[0] = '\0';
  _out = &PTR__CmdLine_00136cd0;
  local_240._M_p = (pointer)0x0;
  local_250 = (pointer)0x0;
  pbStack_248 = (pointer)0x0;
  local_238._M_p = local_230 + 8;
  aiStack_2b0 = (int  [2])0x0;
  local_2a8 = (pointer)0x0;
  iStack_2a0._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_298 = (pointer)0x0;
  puStack_290 = (pointer)0x0;
  local_288 = (tag_t<cfgfile::string_trait_t> *)0x0;
  pCStack_280 = (Command *)0x0;
  local_278 = (Command *)0x0;
  _Stack_270._M_p = (pointer)0x0;
  local_268 = (pointer)0x0;
  aStack_260._M_allocated_capacity = 0;
  aStack_260._8_4_ = 0;
  local_230._0_8_ = 0;
  local_230[8] = '\0';
  std::__cxx11::string::string((string *)&d,"Input file name",&local_829);
  model.m_root.m_name._M_dataplus._M_p = (pointer)&model.m_root.m_name.field_2;
  model.m_root.m_name._M_string_length = 0;
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  local_828._M_string_length = 0;
  model.m_root.m_name.field_2._M_local_buf[0] = '\0';
  local_828.field_2._M_local_buf[0] = '\0';
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  local_808._M_string_length = 0;
  local_808.field_2._M_local_buf[0] = '\0';
  pCVar3 = Args::details::
           API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
           ::addArgWithFlagAndName<char_const(&)[6]>
                     ((API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
                       *)&out,'i',(char (*) [6])"input",true,true,(String *)&d,(String *)&model,
                      &local_828,&local_808);
  std::__cxx11::string::string((string *)&local_7c8,"Output file name",&local_82a);
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  local_7e8._M_string_length = 0;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  local_7a8._M_string_length = 0;
  local_7e8.field_2._M_local_buf[0] = '\0';
  local_7a8.field_2._M_local_buf[0] = '\0';
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  local_728._M_string_length = 0;
  local_728.field_2._M_local_buf[0] = '\0';
  pCVar3 = Args::details::
           API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
           ::addArgWithFlagAndName<char_const(&)[7]>
                     ((API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
                       *)pCVar3,'o',(char (*) [7])"output",true,true,&local_7c8,&local_7e8,
                      &local_7a8,&local_728);
  std::__cxx11::string::string((string *)&local_748,*argv,&local_82b);
  std::__cxx11::string::string((string *)&local_6e8,"C++ header generator for cfgfile.",&local_82c);
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  local_708._M_string_length = 0;
  local_708.field_2._M_local_buf[0] = '\0';
  Args::CmdLine::addHelp(pCVar3,true,&local_748,&local_6e8,0x4f,&local_708);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&model);
  std::__cxx11::string::~string((string *)&d);
  Args::CmdLine::parse((CmdLine *)&out,argc,argv);
  std::__cxx11::string::string((string *)&model,"-i",(allocator *)&local_7c8);
  Args::CmdLine::value((String *)&d,(CmdLine *)&out,(String *)&model);
  std::__cxx11::string::string((string *)&local_808,"-o",(allocator *)&local_7e8);
  Args::CmdLine::value(&local_828,(CmdLine *)&out,&local_808);
  for_generation_t::for_generation_t((for_generation_t *)&in,(string *)&d,&local_828);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&d);
  std::__cxx11::string::~string((string *)&model);
  if (local_4d0 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Please specify input file.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else if (local_4b0 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Please specify output file.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    Args::CmdLine::~CmdLine((CmdLine *)&out);
    for_generation_t::operator=(&data,(for_generation_t *)&in);
    for_generation_t::~for_generation_t((for_generation_t *)&in);
    std::ifstream::ifstream(&in,(string *)&data,_S_in);
    if (*(int *)((long)aiStack_4b8 + *(long *)(_in + -0x18)) == 0) {
      cfgfile::generator::cfg::model_t::model_t(&model);
      cfgfile::generator::cfg::tag_model_t::tag_model_t((tag_model_t *)&out);
      d.m_stream = (istream_t *)&in;
      fVar2 = cfgfile::details::determine_format_t<cfgfile::string_trait_t>::format(&d);
      cfgfile::string_trait_t::to_begin((istream_t *)&in);
      if (fVar2 == cfgfile_format) {
        cfgfile::input_stream_t<cfgfile::string_trait_t>::input_stream_t
                  ((input_stream_t<cfgfile::string_trait_t> *)&d,&data.m_input_file_name,
                   (istream_t *)&in);
        cfgfile::parser_t<cfgfile::string_trait_t>::parser_t
                  ((parser_t<cfgfile::string_trait_t> *)&local_828,
                   (tag_t<cfgfile::string_trait_t> *)&out,
                   (input_stream_t<cfgfile::string_trait_t> *)&d);
        (**(code **)(*(size_type *)local_828._M_dataplus._M_p + 0x10))
                  (local_828._M_dataplus._M_p,&data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_828._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_828._M_dataplus._M_p + 8))();
        }
        cfgfile::input_stream_t<cfgfile::string_trait_t>::~input_stream_t
                  ((input_stream_t<cfgfile::string_trait_t> *)&d);
      }
      else if (fVar2 == xml_format) {
        this = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_7c8,"XML supported only with Qt. Parsing of file \"",
                   (allocator *)&local_728);
        std::__cxx11::string::string((string *)&local_808,(string *)&local_7c8);
        std::operator+(&local_828,&local_808,&data.m_input_file_name);
        std::__cxx11::string::string((string *)&local_7a8,"\" failed.",(allocator *)&local_748);
        std::__cxx11::string::string((string *)&local_7e8,(string *)&local_7a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                       &local_828,&local_7e8);
        cfgfile::exception_t<cfgfile::string_trait_t>::exception_t(this,(string_t *)&d);
        __cxa_throw(this,&cfgfile::exception_t<cfgfile::string_trait_t>::typeinfo,
                    cfgfile::exception_t<cfgfile::string_trait_t>::~exception_t);
      }
      std::ifstream::close();
      cfgfile::generator::cfg::tag_model_t::cfg((model_t *)&d,(tag_model_t *)&out);
      cfgfile::generator::cfg::model_t::operator=(&model,(model_t *)&d);
      cfgfile::generator::cfg::model_t::~model_t((model_t *)&d);
      cfgfile::generator::cfg::model_t::prepare(&model);
      cfgfile::generator::cfg::model_t::check(&model);
      cfgfile::generator::cfg::tag_model_t::~tag_model_t((tag_model_t *)&out);
      std::ofstream::ofstream(&out,(string *)&data.m_output_file_name,_S_out);
      iVar1 = *(int *)((long)aiStack_2b0 + (long)((_func_int **)_out)[-3]);
      if (iVar1 == 0) {
        cfgfile::generator::cpp_generator_t::cpp_generator_t((cpp_generator_t *)&d,&model);
        cfgfile::generator::cpp_generator_t::generate((cpp_generator_t *)&d,(ostream *)&out);
        std::ofstream::close();
        cfgfile::generator::cpp_generator_t::~cpp_generator_t((cpp_generator_t *)&d);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"Couldn\'t open output file for writting.");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      std::ofstream::~ofstream(&out);
      cfgfile::generator::cfg::model_t::~model_t(&model);
      std::ifstream::~ifstream(&in);
      for_generation_t::~for_generation_t(&data);
      return (uint)(iVar1 != 0);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Specified input file doesn\'t exist.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  exit(1);
}

Assistant:

int main( int argc, char ** argv )
{	
	for_generation_t data;

	try {
		data = parse_cli( argc, argv );
	}
	catch( const Args::HelpHasBeenPrintedException & )
	{
		return 0;
	}
	catch( const Args::BaseException & x )
	{
		std::cout << x.desc() << std::endl;

		return 1;
	}

	std::ifstream in( data.input_file() );

	if( !in.good() )
	{
		std::cout << "Specified input file doesn't exist." << std::endl;

		exit( 1 );
	}

	cfgfile::generator::cfg::model_t model;

	try {
		cfgfile::generator::cfg::tag_model_t tag;

		cfgfile::read_cfgfile( tag, in, data.input_file() );

		in.close();

		model = tag.cfg();

		model.prepare();

		model.check();
	}
	catch( const cfgfile::exception_t< cfgfile::string_trait_t > & x )
	{
		in.close();

		std::cout << x.desc() << std::endl;

		return 1;
	}

	std::ofstream out( data.output_file() );

	if( out.good() )
	{
		cfgfile::generator::cpp_generator_t gen( model );

		gen.generate( out );

		out.close();

		return 0;
	}
	else
	{
		std::cout << "Couldn't open output file for writting."
			<< std::endl;

		return 1;
	}
}